

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapSetInfo(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  JavascriptLibrary *pJVar1;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapType->JsTypeId == TypeIds_Set) {
    pJVar1 = Js::ScriptContext::GetLibrary(this);
    snpObject_local = (SnapObject *)Js::JavascriptLibrary::CreateSet_TTD(pJVar1);
  }
  else {
    pJVar1 = Js::ScriptContext::GetLibrary(this);
    snpObject_local = (SnapObject *)Js::JavascriptLibrary::CreateWeakSet_TTD(pJVar1);
  }
  return (RecyclableObject *)snpObject_local;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapSetInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            if(snpObject->SnapType->JsTypeId == Js::TypeIds_Set)
            {
                return ctx->GetLibrary()->CreateSet_TTD();
            }
            else
            {
                return ctx->GetLibrary()->CreateWeakSet_TTD();
            }
        }